

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O0

QLoggingCategory * lcDD(void)

{
  int iVar1;
  
  if (lcDD()::category == '\0') {
    iVar1 = __cxa_guard_acquire(&lcDD()::category);
    if (iVar1 != 0) {
      QLoggingCategory::QLoggingCategory(&lcDD::category,"qt.qpa.input",QtDebugMsg);
      __cxa_atexit(QLoggingCategory::~QLoggingCategory,&lcDD::category,&__dso_handle);
      __cxa_guard_release(&lcDD()::category);
    }
  }
  return &lcDD::category;
}

Assistant:

QDeviceDiscovery *QDeviceDiscovery::create(QDeviceTypes types, QObject *parent)
{
    qCDebug(lcDD) << "udev device discovery for type" << types;

    QDeviceDiscovery *helper = nullptr;
    struct udev *udev;

    udev = udev_new();
    if (udev) {
        helper = new QDeviceDiscoveryUDev(types, udev, parent);
    } else {
        qWarning("Failed to get udev library context");
    }

    return helper;
}